

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_field_base.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::csharp::FieldGeneratorBase::SetCommonFieldVariables
          (FieldGeneratorBase *this,
          flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *variables)

{
  flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_00;
  uint uVar1;
  char *pcVar2;
  FieldDescriptor *pFVar3;
  anon_union_8_1_a8a14541_for_iterator_2 aVar4;
  FieldGeneratorBase *this_01;
  char cVar5;
  bool bVar6;
  long lVar7;
  byte *pbVar8;
  uint uVar9;
  uint uVar10;
  FieldDescriptor *descriptor;
  Descriptor *extraout_RDX;
  Descriptor *extraout_RDX_00;
  Descriptor *descriptor_00;
  anon_union_8_1_a8a14541_for_iterator_2 aVar11;
  FieldGeneratorBase *pFVar12;
  anon_union_8_1_a8a14541_for_iterator_2 aVar13;
  int iVar14;
  ulong uVar15;
  char *pcVar16;
  int iVar17;
  uint8_t tag_array [5];
  string tag_bytes;
  anon_union_8_1_a8a14541_for_iterator_2 local_1e0;
  char *local_1d8;
  undefined1 local_1d0 [17];
  undefined7 uStack_1bf;
  undefined8 uStack_1b8;
  undefined8 local_1b0;
  undefined8 local_1a8;
  undefined8 local_1a0;
  char *local_198;
  anon_union_8_1_a8a14541_for_iterator_2 local_190;
  byte local_185 [5];
  AlphaNum local_180;
  anon_union_8_1_a8a14541_for_iterator_2 local_150;
  anon_union_8_1_a8a14541_for_iterator_2 local_148;
  undefined1 local_140;
  undefined7 uStack_13f;
  char *pcStack_138;
  FieldGeneratorBase *local_120;
  uint local_114;
  anon_union_8_1_a8a14541_for_iterator_2 local_110;
  char *local_108;
  undefined1 local_100 [32];
  undefined1 local_e0 [36];
  uint local_bc;
  AlphaNum local_b8;
  anon_union_8_1_a8a14541_for_iterator_2 local_88;
  anon_union_8_1_a8a14541_for_iterator_2 local_80 [2];
  uint local_6c;
  long *local_68 [2];
  long local_58 [2];
  anon_union_8_1_a8a14541_for_iterator_2 local_48;
  anon_union_8_1_a8a14541_for_iterator_2 local_40;
  anon_union_8_1_a8a14541_for_iterator_2 local_38;
  
  pFVar3 = this->descriptor_;
  iVar17 = *(int *)(pFVar3 + 4);
  uVar1 = iVar17 * 8 + 1;
  iVar14 = 0x1f;
  if (uVar1 != 0) {
    for (; uVar1 >> iVar14 == 0; iVar14 = iVar14 + -1) {
    }
  }
  uVar9 = iVar14 * 9 + 0x49U >> 6;
  local_6c = uVar9 << (pFVar3[2] == (FieldDescriptor)0xa);
  uVar1 = local_6c >> 1;
  if (pFVar3[2] != (FieldDescriptor)0xa) {
    uVar1 = uVar9;
  }
  cVar5 = google::protobuf::FieldDescriptor::is_packed();
  uVar9 = 2;
  if (cVar5 == '\0') {
    uVar9 = *(uint *)((long)&protobuf::internal::WireFormatLite::kWireTypeForFieldType +
                     (ulong)(byte)pFVar3[2] * 4);
  }
  uVar9 = uVar9 | iVar17 << 3;
  pbVar8 = local_185;
  uVar10 = uVar9;
  local_120 = this;
  local_114 = uVar9;
  if (0x7f < uVar9) {
    do {
      *pbVar8 = (byte)uVar10 | 0x80;
      uVar9 = uVar10 >> 7;
      pbVar8 = pbVar8 + 1;
      bVar6 = 0x3fff < uVar10;
      uVar10 = uVar9;
    } while (bVar6);
  }
  *pbVar8 = (byte)uVar9;
  local_190 = (anon_union_8_1_a8a14541_for_iterator_2)variables;
  lVar7 = absl::lts_20240722::numbers_internal::FastIntToBuffer((uint)local_185[0],local_1d0);
  local_1e0.slot_ = (slot_type *)(lVar7 - (long)local_1d0);
  local_68[0] = local_58;
  local_1d8 = local_1d0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_68,local_1d0,lVar7);
  local_bc = uVar1;
  if (1 < uVar1) {
    uVar15 = 1;
    do {
      local_1e0 = (anon_union_8_1_a8a14541_for_iterator_2)0x2;
      local_1d8 = ", ";
      pcVar16 = local_180.digits_;
      lVar7 = absl::lts_20240722::numbers_internal::FastIntToBuffer((uint)local_185[uVar15],pcVar16)
      ;
      local_180.piece_._M_len = lVar7 - (long)pcVar16;
      local_180.piece_._M_str = pcVar16;
      absl::lts_20240722::StrAppend((string *)local_68,(AlphaNum *)&local_1e0,&local_180);
      uVar15 = uVar15 + 1;
    } while (uVar1 != uVar15);
  }
  lVar7 = absl::lts_20240722::numbers_internal::FastIntToBuffer(local_114,local_1d0);
  pcVar16 = local_180.digits_;
  local_1e0.slot_ = (slot_type *)(lVar7 - (long)local_1d0);
  local_1d8 = local_1d0;
  local_180.piece_._M_len = (size_t)pcVar16;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_180,local_1d0,lVar7);
  aVar11 = local_190;
  absl::lts_20240722::container_internal::
  raw_hash_map<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
  ::try_emplace_impl<char_const(&)[4]>
            ((pair<absl::lts_20240722::container_internal::raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
              *)&local_b8,local_190.slot_,(char (*) [4])0x3fcb35);
  std::__cxx11::string::operator=((string *)(local_b8.piece_._M_str + 0x10),(string *)&local_180);
  if ((char *)local_180.piece_._M_len != pcVar16) {
    operator_delete((void *)local_180.piece_._M_len,local_180.digits_._0_8_ + 1);
  }
  lVar7 = absl::lts_20240722::numbers_internal::FastIntToBuffer(local_6c,local_1d0);
  uVar1 = local_bc;
  local_1e0.slot_ = (slot_type *)(lVar7 - (long)local_1d0);
  local_1d8 = local_1d0;
  local_180.piece_._M_len = (size_t)pcVar16;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_180,local_1d0,lVar7);
  absl::lts_20240722::container_internal::
  raw_hash_map<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
  ::try_emplace_impl<char_const(&)[9]>
            ((pair<absl::lts_20240722::container_internal::raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
              *)&local_b8,aVar11.slot_,(char (*) [9])"tag_size");
  std::__cxx11::string::operator=((string *)(local_b8.piece_._M_str + 0x10),(string *)&local_180);
  if ((char *)local_180.piece_._M_len != pcVar16) {
    operator_delete((void *)local_180.piece_._M_len,local_180.digits_._0_8_ + 1);
  }
  absl::lts_20240722::container_internal::
  raw_hash_map<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
  ::try_emplace_impl<char_const(&)[10]>
            ((pair<absl::lts_20240722::container_internal::raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
              *)&local_1e0,aVar11.slot_,(char (*) [10])0x3f77af);
  std::__cxx11::string::_M_assign((string *)(local_1d8 + 0x10));
  if (local_120->descriptor_[2] == (FieldDescriptor)0xa) {
    iVar17 = *(int *)(local_120->descriptor_ + 4);
    uVar9 = iVar17 * 8 + 4;
    uVar15 = (ulong)uVar9;
    if ((uint)(iVar17 << 3) < 0x80) {
      pbVar8 = local_185;
    }
    else {
      pbVar8 = local_185;
      do {
        uVar10 = (uint)uVar15;
        *pbVar8 = (byte)uVar15 | 0x80;
        uVar15 = uVar15 >> 7;
        pbVar8 = pbVar8 + 1;
      } while (0x3fff < uVar10);
    }
    *pbVar8 = (byte)uVar15;
    lVar7 = absl::lts_20240722::numbers_internal::FastIntToBuffer((uint)local_185[0],local_1d0);
    local_1e0.slot_ = (slot_type *)(lVar7 - (long)local_1d0);
    local_1d8 = local_1d0;
    local_180.piece_._M_len = (size_t)pcVar16;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_180,local_1d0,lVar7);
    local_114 = uVar9;
    std::__cxx11::string::operator=((string *)local_68,(string *)&local_180);
    if ((char *)local_180.piece_._M_len != pcVar16) {
      operator_delete((void *)local_180.piece_._M_len,local_180.digits_._0_8_ + 1);
    }
    if (1 < uVar1) {
      uVar15 = 1;
      do {
        local_1e0 = (anon_union_8_1_a8a14541_for_iterator_2)0x2;
        local_1d8 = ", ";
        pcVar16 = local_180.digits_;
        lVar7 = absl::lts_20240722::numbers_internal::FastIntToBuffer
                          ((uint)local_185[uVar15],pcVar16);
        local_180.piece_._M_len = lVar7 - (long)pcVar16;
        local_180.piece_._M_str = pcVar16;
        absl::lts_20240722::StrAppend((string *)local_68,(AlphaNum *)&local_1e0,&local_180);
        uVar15 = uVar15 + 1;
      } while (uVar1 != uVar15);
    }
    lVar7 = absl::lts_20240722::numbers_internal::FastIntToBuffer(local_114,local_1d0);
    local_1e0.slot_ = (slot_type *)(lVar7 - (long)local_1d0);
    local_1d8 = local_1d0;
    local_180.piece_._M_len = (size_t)local_180.digits_;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_180,local_1d0,lVar7);
    this_00 = &local_120->variables_;
    absl::lts_20240722::container_internal::
    raw_hash_map<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
    ::try_emplace_impl<char_const(&)[8]>
              ((pair<absl::lts_20240722::container_internal::raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
                *)&local_b8,this_00,(char (*) [8])"end_tag");
    aVar11 = local_190;
    std::__cxx11::string::operator=((string *)(local_b8.piece_._M_str + 0x10),(string *)&local_180);
    if ((char *)local_180.piece_._M_len != local_180.digits_) {
      operator_delete((void *)local_180.piece_._M_len,local_180.digits_._0_8_ + 1);
    }
    absl::lts_20240722::container_internal::
    raw_hash_map<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
    ::try_emplace_impl<char_const(&)[14]>
              ((pair<absl::lts_20240722::container_internal::raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
                *)&local_1e0,this_00,(char (*) [14])"end_tag_bytes");
    std::__cxx11::string::_M_assign((string *)(local_1d8 + 0x10));
  }
  pcVar16 = local_180.digits_;
  absl::lts_20240722::container_internal::
  raw_hash_map<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
  ::try_emplace_impl<char_const(&)[13]>
            ((pair<absl::lts_20240722::container_internal::raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
              *)&local_1e0,aVar11.slot_,(char (*) [13])"access_level");
  std::__cxx11::string::_M_replace
            ((ulong)(local_1d8 + 0x10),0,*(char **)(local_1d8 + 0x18),0x394a3e);
  pFVar12 = local_120;
  GetPropertyName_abi_cxx11_((string *)&local_1e0,(csharp *)local_120->descriptor_,descriptor);
  absl::lts_20240722::container_internal::
  raw_hash_map<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
  ::try_emplace_impl<char_const(&)[14]>
            ((pair<absl::lts_20240722::container_internal::raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
              *)&local_180,aVar11.slot_,(char (*) [14])0x3f7893);
  std::__cxx11::string::operator=((string *)(local_180.piece_._M_str + 0x10),(string *)&local_1e0);
  if (local_1e0.slot_ != (slot_type *)local_1d0) {
    operator_delete(local_1e0.slot_,local_1d0._0_8_ + 1);
  }
  type_name_abi_cxx11_((string *)&local_1e0,pFVar12,pFVar12->descriptor_);
  absl::lts_20240722::container_internal::
  raw_hash_map<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
  ::try_emplace_impl<char_const(&)[10]>
            ((pair<absl::lts_20240722::container_internal::raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
              *)&local_180,aVar11.slot_,(char (*) [10])0x3f77d3);
  std::__cxx11::string::operator=((string *)(local_180.piece_._M_str + 0x10),(string *)&local_1e0);
  descriptor_00 = extraout_RDX;
  if (local_1e0.slot_ != (slot_type *)local_1d0) {
    operator_delete(local_1e0.slot_,local_1d0._0_8_ + 1);
    descriptor_00 = extraout_RDX_00;
  }
  GetClassName_abi_cxx11_
            ((string *)&local_1e0,*(csharp **)(pFVar12->descriptor_ + 0x20),descriptor_00);
  absl::lts_20240722::container_internal::
  raw_hash_map<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
  ::try_emplace_impl<char_const(&)[14]>
            ((pair<absl::lts_20240722::container_internal::raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
              *)&local_180,aVar11.slot_,(char (*) [14])"extended_type");
  std::__cxx11::string::operator=((string *)(local_180.piece_._M_str + 0x10),(string *)&local_1e0);
  if (local_1e0.slot_ != (slot_type *)local_1d0) {
    operator_delete(local_1e0.slot_,local_1d0._0_8_ + 1);
  }
  name_abi_cxx11_((string *)&local_1e0,pFVar12);
  absl::lts_20240722::container_internal::
  raw_hash_map<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
  ::try_emplace_impl<char_const(&)[5]>
            ((pair<absl::lts_20240722::container_internal::raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
              *)&local_180,aVar11.slot_,(char (*) [5])0x467b4f);
  std::__cxx11::string::operator=((string *)(local_180.piece_._M_str + 0x10),(string *)&local_1e0);
  if (local_1e0.slot_ != (slot_type *)local_1d0) {
    operator_delete(local_1e0.slot_,local_1d0._0_8_ + 1);
  }
  pFVar12 = *(FieldGeneratorBase **)(pFVar12->descriptor_ + 8);
  absl::lts_20240722::container_internal::
  raw_hash_map<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
  ::try_emplace_impl<char_const(&)[16]>
            ((pair<absl::lts_20240722::container_internal::raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
              *)&local_1e0,aVar11.slot_,(char (*) [16])0x469227);
  std::__cxx11::string::_M_assign((string *)(local_1d8 + 0x10));
  this_01 = local_120;
  default_value_abi_cxx11_((string *)&local_1e0,pFVar12,local_120->descriptor_);
  absl::lts_20240722::container_internal::
  raw_hash_map<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
  ::try_emplace_impl<char_const(&)[14]>
            ((pair<absl::lts_20240722::container_internal::raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
              *)&local_180,aVar11.slot_,(char (*) [14])0x41423a);
  std::__cxx11::string::operator=((string *)(local_180.piece_._M_str + 0x10),(string *)&local_1e0);
  if (local_1e0.slot_ != (slot_type *)local_1d0) {
    operator_delete(local_1e0.slot_,local_1d0._0_8_ + 1);
  }
  capitalized_type_name_abi_cxx11_((string *)&local_1e0,this_01);
  absl::lts_20240722::container_internal::
  raw_hash_map<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
  ::try_emplace_impl<char_const(&)[22]>
            ((pair<absl::lts_20240722::container_internal::raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
              *)&local_180,aVar11.slot_,(char (*) [22])"capitalized_type_name");
  std::__cxx11::string::operator=((string *)(local_180.piece_._M_str + 0x10),(string *)&local_1e0);
  if (local_1e0.slot_ != (slot_type *)local_1d0) {
    operator_delete(local_1e0.slot_,local_1d0._0_8_ + 1);
  }
  number_abi_cxx11_((string *)&local_1e0,this_01);
  absl::lts_20240722::container_internal::
  raw_hash_map<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
  ::try_emplace_impl<char_const(&)[7]>
            ((pair<absl::lts_20240722::container_internal::raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
              *)&local_180,aVar11.slot_,(char (*) [7])0x4695c0);
  std::__cxx11::string::operator=((string *)(local_180.piece_._M_str + 0x10),(string *)&local_1e0);
  if (local_1e0.slot_ != (slot_type *)local_1d0) {
    operator_delete(local_1e0.slot_,local_1d0._0_8_ + 1);
  }
  bVar6 = has_default_value(local_120);
  if ((bVar6) &&
     ((local_120->descriptor_[2] == (FieldDescriptor)0xb ||
      (cVar5 = google::protobuf::FieldDescriptor::has_presence(), cVar5 == '\0')))) {
    absl::lts_20240722::container_internal::
    raw_hash_map<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
    ::try_emplace_impl<char_const(&)[5]>
              ((pair<absl::lts_20240722::container_internal::raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
                *)&local_b8,aVar11.slot_,(char (*) [5])0x467b4f);
    local_180.piece_._M_str = *(char **)(local_b8.piece_._M_str + 0x10);
    local_180.piece_._M_len = *(size_t *)(local_b8.piece_._M_str + 0x18);
    local_b8.piece_._M_len = 4;
    local_b8.piece_._M_str = "_ = ";
    absl::lts_20240722::container_internal::
    raw_hash_map<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
    ::try_emplace_impl<char_const(&)[14]>
              ((pair<absl::lts_20240722::container_internal::raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
                *)(local_100 + 0x20),aVar11.slot_,(char (*) [14])0x41423a);
    local_148 = *(anon_union_8_1_a8a14541_for_iterator_2 *)(local_e0._8_8_ + 0x10);
    local_150 = *(anon_union_8_1_a8a14541_for_iterator_2 *)(local_e0._8_8_ + 0x18);
    absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)&local_110,&local_180,&local_b8);
    local_1e0 = (anon_union_8_1_a8a14541_for_iterator_2)0x10;
    local_1d8 = "name_def_message";
    if (local_110.slot_ == (slot_type *)local_100) {
      uStack_1b8 = local_100._8_8_;
      local_1d0._0_8_ = (long)local_1d0 + 0x10U;
    }
    else {
      local_1d0._0_8_ = local_110;
    }
    uStack_1bf = local_100._1_7_;
    local_1d0[0x10] = local_100[0];
    local_1d0._8_8_ = local_108;
    local_108 = (char *)0x0;
    local_100[0] = 0;
    local_80[0].slot_ = (slot_type *)local_1d0;
    local_110.slot_ = (slot_type *)local_100;
    local_88.slot_ = (slot_type *)&local_1e0;
    local_48 = aVar11;
    absl::lts_20240722::container_internal::
    raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
    ::EmplaceDecomposable::operator()
              ((pair<absl::lts_20240722::container_internal::raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
                *)(local_100 + 0x20),&local_48,
               (basic_string_view<char,_std::char_traits<char>_> *)&local_1e0,
               (piecewise_construct_t *)&std::piecewise_construct,
               (tuple<std::basic_string_view<char,_std::char_traits<char>_>_&&> *)&local_88,
               (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&&>
                *)local_80);
    if (local_1d0._0_8_ != (long)local_1d0 + 0x10U) {
      operator_delete((void *)local_1d0._0_8_,(ulong)(stack0xfffffffffffffe40 + 1));
    }
    if (local_110.slot_ != (slot_type *)local_100) {
      lVar7 = CONCAT71(local_100._1_7_,local_100[0]);
      aVar13 = local_110;
LAB_002331d0:
      operator_delete(aVar13.slot_,lVar7 + 1);
    }
  }
  else {
    absl::lts_20240722::container_internal::
    raw_hash_map<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
    ::try_emplace_impl<char_const(&)[5]>
              ((pair<absl::lts_20240722::container_internal::raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
                *)&local_b8,aVar11.slot_,(char (*) [5])0x467b4f);
    local_180.piece_._M_str = *(char **)(local_b8.piece_._M_str + 0x10);
    local_180.piece_._M_len = *(size_t *)(local_b8.piece_._M_str + 0x18);
    local_b8.piece_._M_len = 1;
    local_b8.piece_._M_str = "_";
    absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)&local_150,&local_180);
    local_1e0 = (anon_union_8_1_a8a14541_for_iterator_2)0x10;
    local_1d8 = "name_def_message";
    if (local_150.slot_ == (slot_type *)&local_140) {
      uStack_1b8 = pcStack_138;
      local_1d0._0_8_ = (long)local_1d0 + 0x10U;
    }
    else {
      local_1d0._0_8_ = local_150;
    }
    uStack_1bf = uStack_13f;
    local_1d0[0x10] = local_140;
    local_1d0._8_8_ = local_148;
    local_148.slot_ = (slot_type *)0x0;
    local_140 = 0;
    local_e0._8_8_ = local_1d0;
    local_150.slot_ = (slot_type *)&local_140;
    local_e0._0_8_ = (slot_type *)&local_1e0;
    local_88 = aVar11;
    absl::lts_20240722::container_internal::
    raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
    ::EmplaceDecomposable::operator()
              ((pair<absl::lts_20240722::container_internal::raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
                *)&local_110,&local_88,
               (basic_string_view<char,_std::char_traits<char>_> *)&local_1e0,
               (piecewise_construct_t *)&std::piecewise_construct,
               (tuple<std::basic_string_view<char,_std::char_traits<char>_>_&&> *)(local_100 + 0x20)
               ,(tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&&>
                 *)(local_e0 + 8));
    if (local_1d0._0_8_ != (long)local_1d0 + 0x10U) {
      operator_delete((void *)local_1d0._0_8_,(ulong)(stack0xfffffffffffffe40 + 1));
    }
    if (local_150.slot_ != (slot_type *)&local_140) {
      lVar7 = CONCAT71(uStack_13f,local_140);
      aVar13 = local_150;
      goto LAB_002331d0;
    }
  }
  if ((local_120->descriptor_[2] == (FieldDescriptor)0xb) ||
     (cVar5 = google::protobuf::FieldDescriptor::has_presence(), cVar5 == '\0')) {
    absl::lts_20240722::container_internal::
    raw_hash_map<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
    ::try_emplace_impl<char_const(&)[14]>
              ((pair<absl::lts_20240722::container_internal::raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
                *)&local_b8,aVar11.slot_,(char (*) [14])0x3f7893);
    local_180.piece_._M_str = *(char **)(local_b8.piece_._M_str + 0x10);
    local_180.piece_._M_len = *(size_t *)(local_b8.piece_._M_str + 0x18);
    local_b8.piece_._M_len = 4;
    local_b8.piece_._M_str = " != ";
    absl::lts_20240722::container_internal::
    raw_hash_map<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
    ::try_emplace_impl<char_const(&)[14]>
              ((pair<absl::lts_20240722::container_internal::raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
                *)(local_100 + 0x20),aVar11.slot_,(char (*) [14])0x41423a);
    local_148 = *(anon_union_8_1_a8a14541_for_iterator_2 *)(local_e0._8_8_ + 0x10);
    local_150 = *(anon_union_8_1_a8a14541_for_iterator_2 *)(local_e0._8_8_ + 0x18);
    absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)&local_110,&local_180,&local_b8);
    aVar13 = (anon_union_8_1_a8a14541_for_iterator_2)((long)local_1d0 + 0x10);
    local_1e0 = (anon_union_8_1_a8a14541_for_iterator_2)0x12;
    local_1d8 = "has_property_check";
    if (local_110.slot_ == (slot_type *)local_100) {
      uStack_1b8 = local_100._8_8_;
      local_1d0._0_8_ = aVar13;
    }
    else {
      local_1d0._0_8_ = local_110;
    }
    uStack_1bf = local_100._1_7_;
    local_1d0[0x10] = local_100[0];
    local_1d0._8_8_ = local_108;
    local_108 = (char *)0x0;
    local_100[0] = 0;
    local_110.slot_ = (slot_type *)local_100;
    local_88.slot_ = (slot_type *)&local_1e0;
    local_80[0].slot_ = (slot_type *)local_1d0;
    local_48 = aVar11;
    absl::lts_20240722::container_internal::
    raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
    ::EmplaceDecomposable::operator()
              ((pair<absl::lts_20240722::container_internal::raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
                *)(local_100 + 0x20),&local_48,
               (basic_string_view<char,_std::char_traits<char>_> *)&local_1e0,
               (piecewise_construct_t *)&std::piecewise_construct,
               (tuple<std::basic_string_view<char,_std::char_traits<char>_>_&&> *)&local_88,
               (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&&>
                *)local_80);
    if ((slot_type *)local_1d0._0_8_ != aVar13.slot_) {
      operator_delete((void *)local_1d0._0_8_,(ulong)(stack0xfffffffffffffe40 + 1));
    }
    if (local_110.slot_ != (slot_type *)local_100) {
      operator_delete(local_110.slot_,CONCAT71(local_100._1_7_,local_100[0]) + 1);
    }
    local_180.piece_._M_len = 6;
    local_180.piece_._M_str = "other.";
    absl::lts_20240722::container_internal::
    raw_hash_map<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
    ::try_emplace_impl<char_const(&)[14]>
              ((pair<absl::lts_20240722::container_internal::raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
                *)&local_150,aVar11.slot_,(char (*) [14])0x3f7893);
    local_b8.piece_._M_str = *(char **)((long)local_148.slot_ + 0x10);
    local_b8.piece_._M_len = *(undefined8 *)((long)local_148.slot_ + 0x18);
    local_150 = (anon_union_8_1_a8a14541_for_iterator_2)0x4;
    local_148.slot_ = (slot_type *)0x411017;
    absl::lts_20240722::container_internal::
    raw_hash_map<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
    ::try_emplace_impl<char_const(&)[14]>
              ((pair<absl::lts_20240722::container_internal::raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
                *)&local_88,aVar11.slot_,(char (*) [14])0x41423a);
    local_108 = *(char **)((long)local_80[0].slot_ + 0x10);
    local_110 = *(anon_union_8_1_a8a14541_for_iterator_2 *)((long)local_80[0].slot_ + 0x18);
    absl::lts_20240722::StrCat_abi_cxx11_
              ((AlphaNum *)(local_100 + 0x20),&local_180,&local_b8,(AlphaNum *)&local_150);
    local_1e0 = (anon_union_8_1_a8a14541_for_iterator_2)0x18;
    local_1d8 = "other_has_property_check";
    aVar4.slot_ = (slot_type *)(local_e0 + 0x10);
    if ((slot_type *)local_e0._0_8_ == aVar4.slot_) {
      uStack_1b8 = local_e0._24_8_;
      local_1d0._0_8_ = aVar13;
    }
    else {
      local_1d0._0_8_ = local_e0._0_8_;
    }
    uStack_1bf = local_e0._17_7_;
    local_1d0[0x10] = local_e0[0x10];
    local_1d0._8_8_ = local_e0._8_8_;
    local_e0._8_8_ = (slot_type *)0x0;
    local_e0[0x10] = 0;
    local_e0._0_8_ = aVar4.slot_;
    local_48.slot_ = (slot_type *)&local_1e0;
    local_40.slot_ = (slot_type *)local_1d0;
    local_38 = aVar11;
    absl::lts_20240722::container_internal::
    raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
    ::EmplaceDecomposable::operator()
              ((pair<absl::lts_20240722::container_internal::raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
                *)&local_88,&local_38,(basic_string_view<char,_std::char_traits<char>_> *)&local_1e0
               ,(piecewise_construct_t *)&std::piecewise_construct,
               (tuple<std::basic_string_view<char,_std::char_traits<char>_>_&&> *)&local_48,
               (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&&>
                *)&local_40);
    if ((slot_type *)local_1d0._0_8_ != aVar13.slot_) {
      operator_delete((void *)local_1d0._0_8_,(ulong)(stack0xfffffffffffffe40 + 1));
    }
    if ((slot_type *)local_e0._0_8_ == aVar4.slot_) goto LAB_002335b0;
    lVar7 = CONCAT71(local_e0._17_7_,local_e0[0x10]);
    aVar11 = (anon_union_8_1_a8a14541_for_iterator_2)local_e0._0_8_;
  }
  else {
    local_180.piece_._M_len = 3;
    local_180.piece_._M_str = "Has";
    absl::lts_20240722::container_internal::
    raw_hash_map<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
    ::try_emplace_impl<char_const(&)[14]>
              ((pair<absl::lts_20240722::container_internal::raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
                *)&local_110,aVar11.slot_,(char (*) [14])0x3f7893);
    local_b8.piece_._M_str = *(char **)(local_108 + 0x10);
    local_b8.piece_._M_len = *(size_t *)(local_108 + 0x18);
    absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)&local_150,&local_180);
    aVar11 = (anon_union_8_1_a8a14541_for_iterator_2)((long)local_1d0 + 0x10);
    local_1e0 = (anon_union_8_1_a8a14541_for_iterator_2)0x12;
    local_1d8 = "has_property_check";
    if (local_150.slot_ == (slot_type *)&local_140) {
      uStack_1b8 = pcStack_138;
      local_1d0._0_8_ = aVar11;
    }
    else {
      local_1d0._0_8_ = local_150;
    }
    uStack_1bf = uStack_13f;
    local_1d0[0x10] = local_140;
    local_1d0._8_8_ = local_148;
    local_148.slot_ = (slot_type *)0x0;
    local_140 = 0;
    local_88.slot_ = (slot_type *)local_190;
    local_150.slot_ = (slot_type *)&local_140;
    local_e0._0_8_ = (slot_type *)&local_1e0;
    local_e0._8_8_ = (slot_type *)local_1d0;
    absl::lts_20240722::container_internal::
    raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
    ::EmplaceDecomposable::operator()
              ((pair<absl::lts_20240722::container_internal::raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
                *)&local_110,&local_88,
               (basic_string_view<char,_std::char_traits<char>_> *)&local_1e0,
               (piecewise_construct_t *)&std::piecewise_construct,
               (tuple<std::basic_string_view<char,_std::char_traits<char>_>_&&> *)(local_100 + 0x20)
               ,(tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&&>
                 *)(local_e0 + 8));
    if ((slot_type *)local_1d0._0_8_ != aVar11.slot_) {
      operator_delete((void *)local_1d0._0_8_,(ulong)(stack0xfffffffffffffe40 + 1));
    }
    if (local_150.slot_ != (slot_type *)&local_140) {
      operator_delete(local_150.slot_,CONCAT71(uStack_13f,local_140) + 1);
    }
    local_180.piece_._M_len = 9;
    local_180.piece_._M_str = "other.Has";
    absl::lts_20240722::container_internal::
    raw_hash_map<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
    ::try_emplace_impl<char_const(&)[14]>
              ((pair<absl::lts_20240722::container_internal::raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
                *)&local_110,local_190.slot_,(char (*) [14])0x3f7893);
    local_b8.piece_._M_str = *(char **)(local_108 + 0x10);
    local_b8.piece_._M_len = *(size_t *)(local_108 + 0x18);
    absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)&local_150,&local_180);
    local_1e0 = (anon_union_8_1_a8a14541_for_iterator_2)0x18;
    local_1d8 = "other_has_property_check";
    if (local_150.slot_ == (slot_type *)&local_140) {
      uStack_1b8 = pcStack_138;
      local_1d0._0_8_ = aVar11;
    }
    else {
      local_1d0._0_8_ = local_150;
    }
    uStack_1bf = uStack_13f;
    local_1d0[0x10] = local_140;
    local_1d0._8_8_ = local_148;
    local_148.slot_ = (slot_type *)0x0;
    local_140 = 0;
    local_88.slot_ = (slot_type *)local_190;
    local_150.slot_ = (slot_type *)&local_140;
    local_e0._0_8_ = (slot_type *)&local_1e0;
    local_e0._8_8_ = (slot_type *)local_1d0;
    absl::lts_20240722::container_internal::
    raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
    ::EmplaceDecomposable::operator()
              ((pair<absl::lts_20240722::container_internal::raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
                *)&local_110,&local_88,
               (basic_string_view<char,_std::char_traits<char>_> *)&local_1e0,
               (piecewise_construct_t *)&std::piecewise_construct,
               (tuple<std::basic_string_view<char,_std::char_traits<char>_>_&&> *)(local_100 + 0x20)
               ,(tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&&>
                 *)(local_e0 + 8));
    if ((slot_type *)local_1d0._0_8_ != aVar11.slot_) {
      operator_delete((void *)local_1d0._0_8_,(ulong)(stack0xfffffffffffffe40 + 1));
    }
    if (local_150.slot_ != (slot_type *)&local_140) {
      operator_delete(local_150.slot_,CONCAT71(uStack_13f,local_140) + 1);
    }
    local_180.piece_._M_len = 1;
    local_180.piece_._M_str = "!";
    absl::lts_20240722::container_internal::
    raw_hash_map<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
    ::try_emplace_impl<char_const(&)[19]>
              ((pair<absl::lts_20240722::container_internal::raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
                *)&local_110,local_190.slot_,(char (*) [19])0x3f77f4);
    local_b8.piece_._M_str = *(char **)(local_108 + 0x10);
    local_b8.piece_._M_len = *(size_t *)(local_108 + 0x18);
    absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)&local_150,&local_180);
    local_1e0 = (anon_union_8_1_a8a14541_for_iterator_2)0x16;
    local_1d8 = "has_not_property_check";
    if (local_150.slot_ == (slot_type *)&local_140) {
      uStack_1b8 = pcStack_138;
      local_1d0._0_8_ = aVar11;
    }
    else {
      local_1d0._0_8_ = local_150;
    }
    uStack_1bf = uStack_13f;
    local_1d0[0x10] = local_140;
    local_1d0._8_8_ = local_148;
    local_148.slot_ = (slot_type *)0x0;
    local_140 = 0;
    local_88.slot_ = (slot_type *)local_190;
    local_150.slot_ = (slot_type *)&local_140;
    local_e0._0_8_ = (slot_type *)&local_1e0;
    local_e0._8_8_ = (slot_type *)local_1d0;
    absl::lts_20240722::container_internal::
    raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
    ::EmplaceDecomposable::operator()
              ((pair<absl::lts_20240722::container_internal::raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
                *)&local_110,&local_88,
               (basic_string_view<char,_std::char_traits<char>_> *)&local_1e0,
               (piecewise_construct_t *)&std::piecewise_construct,
               (tuple<std::basic_string_view<char,_std::char_traits<char>_>_&&> *)(local_100 + 0x20)
               ,(tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&&>
                 *)(local_e0 + 8));
    if ((slot_type *)local_1d0._0_8_ != aVar11.slot_) {
      operator_delete((void *)local_1d0._0_8_,(ulong)(stack0xfffffffffffffe40 + 1));
    }
    if (local_150.slot_ != (slot_type *)&local_140) {
      operator_delete(local_150.slot_,CONCAT71(uStack_13f,local_140) + 1);
    }
    local_180.piece_._M_len = 1;
    local_180.piece_._M_str = "!";
    absl::lts_20240722::container_internal::
    raw_hash_map<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
    ::try_emplace_impl<char_const(&)[25]>
              ((pair<absl::lts_20240722::container_internal::raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
                *)&local_110,local_190.slot_,(char (*) [25])"other_has_property_check");
    local_b8.piece_._M_str = *(char **)(local_108 + 0x10);
    local_b8.piece_._M_len = *(size_t *)(local_108 + 0x18);
    absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)&local_150,&local_180);
    local_1e0 = (anon_union_8_1_a8a14541_for_iterator_2)0x1c;
    local_1d8 = "other_has_not_property_check";
    if (local_150.slot_ == (slot_type *)&local_140) {
      uStack_1b8 = pcStack_138;
      local_1d0._0_8_ = aVar11;
    }
    else {
      local_1d0._0_8_ = local_150;
    }
    uStack_1bf = uStack_13f;
    local_1d0[0x10] = local_140;
    local_1d0._8_8_ = local_148;
    local_148.slot_ = (slot_type *)0x0;
    local_140 = 0;
    local_88.slot_ = (slot_type *)local_190;
    local_150.slot_ = (slot_type *)&local_140;
    local_e0._0_8_ = (slot_type *)&local_1e0;
    local_e0._8_8_ = (slot_type *)local_1d0;
    absl::lts_20240722::container_internal::
    raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
    ::EmplaceDecomposable::operator()
              ((pair<absl::lts_20240722::container_internal::raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
                *)&local_110,&local_88,
               (basic_string_view<char,_std::char_traits<char>_> *)&local_1e0,
               (piecewise_construct_t *)&std::piecewise_construct,
               (tuple<std::basic_string_view<char,_std::char_traits<char>_>_&&> *)(local_100 + 0x20)
               ,(tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&&>
                 *)(local_e0 + 8));
    pFVar12 = local_120;
    if ((slot_type *)local_1d0._0_8_ != aVar11.slot_) {
      operator_delete((void *)local_1d0._0_8_,(ulong)(stack0xfffffffffffffe40 + 1));
    }
    if (local_150.slot_ != (slot_type *)&local_140) {
      operator_delete(local_150.slot_,CONCAT71(uStack_13f,local_140) + 1);
    }
    iVar17 = pFVar12->presenceIndex_;
    if (iVar17 == -1) goto LAB_002335b0;
    iVar14 = iVar17 + 0x1f;
    if (-1 < iVar17) {
      iVar14 = iVar17;
    }
    iVar14 = iVar14 >> 5;
    iVar17 = 1 << ((byte)iVar17 & 0x1f);
    lVar7 = absl::lts_20240722::numbers_internal::FastIntToBuffer(iVar14,pcVar16);
    local_180.piece_._M_len = lVar7 - (long)pcVar16;
    pcVar2 = local_b8.digits_;
    local_180.piece_._M_str = pcVar16;
    lVar7 = absl::lts_20240722::numbers_internal::FastIntToBuffer(iVar17,pcVar2);
    local_1b0 = lVar7 - (long)pcVar2;
    local_1e0 = (anon_union_8_1_a8a14541_for_iterator_2)0x9;
    local_1d8 = "(_hasBits";
    local_1d0._0_8_ = local_180.piece_._M_len;
    local_1d0._8_8_ = local_180.piece_._M_str;
    stack0xfffffffffffffe40 = (pointer)0x3;
    uStack_1b8 = " & ";
    local_1a0 = 6;
    local_198 = ") != 0";
    local_1a8 = pcVar2;
    local_b8.piece_._M_len = local_1b0;
    local_b8.piece_._M_str = pcVar2;
    absl::lts_20240722::strings_internal::CatPieces_abi_cxx11_(&local_150,&local_1e0,5);
    absl::lts_20240722::container_internal::
    raw_hash_map<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
    ::try_emplace_impl<char_const(&)[16]>
              ((pair<absl::lts_20240722::container_internal::raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
                *)&local_1e0,local_190.slot_,(char (*) [16])"has_field_check");
    std::__cxx11::string::operator=((string *)(local_1d8 + 0x10),(string *)&local_150);
    if (local_150.slot_ != (slot_type *)&local_140) {
      operator_delete(local_150.slot_,CONCAT71(uStack_13f,local_140) + 1);
    }
    local_1e0.slot_ = (slot_type *)&DAT_00000008;
    local_1d8 = "_hasBits";
    lVar7 = absl::lts_20240722::numbers_internal::FastIntToBuffer(iVar14,pcVar16);
    local_180.piece_._M_len = lVar7 - (long)pcVar16;
    local_b8.piece_._M_len = 4;
    local_b8.piece_._M_str = " |= ";
    local_180.piece_._M_str = pcVar16;
    lVar7 = absl::lts_20240722::numbers_internal::FastIntToBuffer(iVar17,(char *)&local_140);
    local_150.slot_ = (slot_type *)(lVar7 - (long)&local_140);
    local_148.slot_ = (slot_type *)&local_140;
    absl::lts_20240722::StrCat_abi_cxx11_
              ((AlphaNum *)&local_110,(AlphaNum *)&local_1e0,&local_180,&local_b8);
    absl::lts_20240722::container_internal::
    raw_hash_map<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
    ::try_emplace_impl<char_const(&)[14]>
              ((pair<absl::lts_20240722::container_internal::raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
                *)(local_100 + 0x20),local_190.slot_,(char (*) [14])"set_has_field");
    std::__cxx11::string::operator=((string *)(local_e0._8_8_ + 0x10),(string *)&local_110);
    if (local_110.slot_ != (slot_type *)local_100) {
      operator_delete(local_110.slot_,CONCAT71(local_100._1_7_,local_100[0]) + 1);
    }
    local_1e0.slot_ = (slot_type *)&DAT_00000008;
    local_1d8 = "_hasBits";
    lVar7 = absl::lts_20240722::numbers_internal::FastIntToBuffer(iVar14,pcVar16);
    local_180.piece_._M_len = lVar7 - (long)pcVar16;
    local_b8.piece_._M_len = (size_t)&DAT_00000005;
    local_b8.piece_._M_str = " &= ~";
    local_180.piece_._M_str = pcVar16;
    lVar7 = absl::lts_20240722::numbers_internal::FastIntToBuffer(iVar17,(char *)&local_140);
    local_150.slot_ = (slot_type *)(lVar7 - (long)&local_140);
    local_148.slot_ = (slot_type *)&local_140;
    absl::lts_20240722::StrCat_abi_cxx11_
              ((AlphaNum *)&local_110,(AlphaNum *)&local_1e0,&local_180,&local_b8);
    absl::lts_20240722::container_internal::
    raw_hash_map<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
    ::try_emplace_impl<char_const(&)[16]>
              ((pair<absl::lts_20240722::container_internal::raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
                *)(local_100 + 0x20),local_190.slot_,(char (*) [16])"clear_has_field");
    std::__cxx11::string::operator=((string *)(local_e0._8_8_ + 0x10),(string *)&local_110);
    if (local_110.slot_ == (slot_type *)local_100) goto LAB_002335b0;
    lVar7 = CONCAT71(local_100._1_7_,local_100[0]);
    aVar11 = local_110;
  }
  operator_delete(aVar11.slot_,lVar7 + 1);
LAB_002335b0:
  if (local_68[0] != local_58) {
    operator_delete(local_68[0],local_58[0] + 1);
  }
  return;
}

Assistant:

void FieldGeneratorBase::SetCommonFieldVariables(
    absl::flat_hash_map<absl::string_view, std::string>* variables) {
  // Note: this will be valid even though the tag emitted for packed and unpacked versions of
  // repeated fields varies by wire format. The wire format is encoded in the bottom 3 bits, which
  // never effects the tag size.
  int tag_size = internal::WireFormat::TagSize(descriptor_->number(), descriptor_->type());
  int part_tag_size = tag_size;
  if (descriptor_->type() == FieldDescriptor::TYPE_GROUP) {
    part_tag_size /= 2;
  }
  uint tag = internal::WireFormat::MakeTag(descriptor_);
  uint8_t tag_array[5];
  io::CodedOutputStream::WriteTagToArray(tag, tag_array);
  std::string tag_bytes = absl::StrCat(tag_array[0]);
  for (int i = 1; i < part_tag_size; i++) {
    absl::StrAppend(&tag_bytes, ", ", tag_array[i]);
  }

  (*variables)["tag"] = absl::StrCat(tag);
  (*variables)["tag_size"] = absl::StrCat(tag_size);
  (*variables)["tag_bytes"] = tag_bytes;

  if (descriptor_->type() == FieldDescriptor::Type::TYPE_GROUP) {
    tag = internal::WireFormatLite::MakeTag(
        descriptor_->number(),
        internal::WireFormatLite::WIRETYPE_END_GROUP);
    io::CodedOutputStream::WriteTagToArray(tag, tag_array);
    tag_bytes = absl::StrCat(tag_array[0]);
    for (int i = 1; i < part_tag_size; i++) {
      absl::StrAppend(&tag_bytes, ", ", tag_array[i]);
    }

    variables_["end_tag"] = absl::StrCat(tag);
    variables_["end_tag_bytes"] = tag_bytes;
  }

  (*variables)["access_level"] = "public";

  (*variables)["property_name"] = property_name();
  (*variables)["type_name"] = type_name();
  (*variables)["extended_type"] = GetClassName(descriptor_->containing_type());
  (*variables)["name"] = name();
  (*variables)["descriptor_name"] = descriptor_->name();
  (*variables)["default_value"] = default_value();
  (*variables)["capitalized_type_name"] = capitalized_type_name();
  (*variables)["number"] = number();
  if (has_default_value() && !SupportsPresenceApi(descriptor_)) {
    variables->insert({"name_def_message",
                       absl::StrCat((*variables)["name"],
                                    "_ = ", (*variables)["default_value"])});
  } else {
    variables->insert(
        {"name_def_message", absl::StrCat((*variables)["name"], "_")});
  }
  if (SupportsPresenceApi(descriptor_)) {
    variables->insert({"has_property_check",
                       absl::StrCat("Has", (*variables)["property_name"])});
    variables->insert(
        {"other_has_property_check",
         absl::StrCat("other.Has", (*variables)["property_name"])});
    variables->insert({"has_not_property_check",
                       absl::StrCat("!", (*variables)["has_property_check"])});
    variables->insert(
        {"other_has_not_property_check",
         absl::StrCat("!", (*variables)["other_has_property_check"])});
    if (presenceIndex_ != -1) {
        const int hasBitsNumber = presenceIndex_ / 32;
        const int hasBitsMask = 1 << (presenceIndex_ % 32);
        (*variables)["has_field_check"] = absl::StrCat(
            "(_hasBits", hasBitsNumber, " & ", hasBitsMask, ") != 0");
        (*variables)["set_has_field"] =
            absl::StrCat("_hasBits", hasBitsNumber, " |= ", hasBitsMask);
        (*variables)["clear_has_field"] =
            absl::StrCat("_hasBits", hasBitsNumber, " &= ~", hasBitsMask);
    }
  } else {
    variables->insert({"has_property_check",
                       absl::StrCat((*variables)["property_name"],
                                    " != ", (*variables)["default_value"])});
    variables->insert({"other_has_property_check",
                       absl::StrCat("other.", (*variables)["property_name"],
                                    " != ", (*variables)["default_value"])});
  }
}